

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_taproot.cpp
# Opt level: O0

TaprootScriptTree * __thiscall
cfd::core::TaprootScriptTree::operator=(TaprootScriptTree *this,TaprootScriptTree *object)

{
  TaprootScriptTree *object_local;
  TaprootScriptTree *this_local;
  
  if (this != object) {
    (this->super_TapBranch).has_leaf_ = (bool)((object->super_TapBranch).has_leaf_ & 1);
    (this->super_TapBranch).leaf_version_ = (object->super_TapBranch).leaf_version_;
    Script::operator=(&(this->super_TapBranch).script_,&(object->super_TapBranch).script_);
    ByteData256::operator=
              (&(this->super_TapBranch).root_commitment_,&(object->super_TapBranch).root_commitment_
              );
    ::std::vector<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>::operator=
              (&(this->super_TapBranch).branch_list_,&(object->super_TapBranch).branch_list_);
    ::std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::operator=
              (&this->nodes_,&object->nodes_);
  }
  return this;
}

Assistant:

TaprootScriptTree& TaprootScriptTree::operator=(
    const TaprootScriptTree& object) & {
  if (this != &object) {
    has_leaf_ = object.has_leaf_;
    leaf_version_ = object.leaf_version_;
    script_ = object.script_;
    root_commitment_ = object.root_commitment_;
    branch_list_ = object.branch_list_;
    nodes_ = object.nodes_;
  }
  return *this;
}